

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ciphercommon_ccm.c
# Opt level: O0

int ccm_tls_cipher(PROV_CCM_CTX *ctx,uchar *out,size_t *padlen,uchar *in,size_t len)

{
  int iVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *in_RCX;
  PROV_CCM_CTX *in_RDX;
  undefined8 *in_RSI;
  byte *in_RDI;
  ulong in_R8;
  size_t olen;
  int rv;
  long local_38;
  int local_2c;
  
  local_2c = 0;
  local_38 = 0;
  iVar1 = ossl_prov_is_running();
  if ((((iVar1 != 0) && (in_RCX != (undefined8 *)0x0)) && (in_RSI == in_RCX)) &&
     (*(long *)(in_RDI + 0x10) + 8U <= in_R8)) {
    if ((*in_RDI & 1) != 0) {
      *in_RSI = *(undefined8 *)(in_RDI + 0x40);
    }
    *(undefined8 *)(in_RDI + 0x34) = *in_RCX;
    lVar2 = in_R8 - (*(long *)(in_RDI + 0x10) + 8);
    iVar1 = ccm_set_iv(in_RDX,(size_t)in_RCX);
    if ((iVar1 != 0) &&
       (iVar1 = (**(code **)(*(long *)(in_RDI + 0x90) + 0x10))
                          (in_RDI,in_RDI + 0x40,*(undefined8 *)(in_RDI + 0x20)), iVar1 != 0)) {
      in_RCX = in_RCX + 1;
      puVar3 = in_RSI + 1;
      if ((*in_RDI & 1) == 0) {
        iVar1 = (**(code **)(*(long *)(in_RDI + 0x90) + 0x20))
                          (in_RDI,in_RCX,puVar3,lVar2,(long)in_RCX + lVar2,
                           *(undefined8 *)(in_RDI + 0x10));
        if (iVar1 == 0) goto LAB_00353c8b;
      }
      else {
        iVar1 = (**(code **)(*(long *)(in_RDI + 0x90) + 0x18))
                          (in_RDI,in_RCX,puVar3,lVar2,(long)puVar3 + lVar2,
                           *(undefined8 *)(in_RDI + 0x10));
        if (iVar1 == 0) goto LAB_00353c8b;
        lVar2 = lVar2 + 8 + *(long *)(in_RDI + 0x10);
      }
      local_38 = lVar2;
      local_2c = 1;
    }
  }
LAB_00353c8b:
  *(long *)in_RDX = local_38;
  return local_2c;
}

Assistant:

static int ccm_tls_cipher(PROV_CCM_CTX *ctx,
                          unsigned char *out, size_t *padlen,
                          const unsigned char *in, size_t len)
{
    int rv = 0;
    size_t olen = 0;

    if (!ossl_prov_is_running())
        goto err;

    /* Encrypt/decrypt must be performed in place */
    if (in == NULL || out != in || len < EVP_CCM_TLS_EXPLICIT_IV_LEN + ctx->m)
        goto err;

    /* If encrypting set explicit IV from sequence number (start of AAD) */
    if (ctx->enc)
        memcpy(out, ctx->buf, EVP_CCM_TLS_EXPLICIT_IV_LEN);
    /* Get rest of IV from explicit IV */
    memcpy(ctx->iv + EVP_CCM_TLS_FIXED_IV_LEN, in, EVP_CCM_TLS_EXPLICIT_IV_LEN);
    /* Correct length value */
    len -= EVP_CCM_TLS_EXPLICIT_IV_LEN + ctx->m;
    if (!ccm_set_iv(ctx, len))
        goto err;

    /* Use saved AAD */
    if (!ctx->hw->setaad(ctx, ctx->buf, ctx->tls_aad_len))
        goto err;

    /* Fix buffer to point to payload */
    in += EVP_CCM_TLS_EXPLICIT_IV_LEN;
    out += EVP_CCM_TLS_EXPLICIT_IV_LEN;
    if (ctx->enc) {
        if (!ctx->hw->auth_encrypt(ctx, in, out, len,  out + len, ctx->m))
            goto err;
        olen = len + EVP_CCM_TLS_EXPLICIT_IV_LEN + ctx->m;
    } else {
        if (!ctx->hw->auth_decrypt(ctx, in, out, len,
                                   (unsigned char *)in + len, ctx->m))
            goto err;
        olen = len;
    }
    rv = 1;
err:
    *padlen = olen;
    return rv;
}